

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

upb_Message *
upb_Message_GetOrCreateMutableMessage
          (upb_Message *msg,upb_MiniTable *mini_table,upb_MiniTableField *f,upb_Arena *arena)

{
  upb_CType uVar1;
  upb_MiniTable *m;
  upb_Message *puVar2;
  
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x21c,
                  "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                 );
  }
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 == kUpb_CType_Message) {
    if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) {
      __assert_fail("!upb_MiniTableField_IsExtension(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x21e,
                    "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                   );
    }
    puVar2 = *(upb_Message **)
              ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
    if (puVar2 == (upb_Message *)0x0) {
      m = upb_MiniTable_SubMessage(mini_table,f);
      if (m == (upb_MiniTable *)0x0) {
        __assert_fail("sub_mini_table",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x224,
                      "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                     );
      }
      puVar2 = _upb_Message_New(m,arena);
      *(upb_Message **)((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only)
           = puVar2;
      _upb_Message_SetPresence_dont_copy_me__upb_internal_use_only(msg,f);
    }
    return puVar2;
  }
  __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x21d,
                "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE struct upb_Message* upb_Message_GetOrCreateMutableMessage(
    struct upb_Message* msg, const upb_MiniTable* mini_table,
    const upb_MiniTableField* f, upb_Arena* arena) {
  UPB_ASSERT(arena);
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(!upb_MiniTableField_IsExtension(f));
  struct upb_Message* sub_message =
      *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*);
  if (!sub_message) {
    const upb_MiniTable* sub_mini_table =
        upb_MiniTable_SubMessage(mini_table, f);
    UPB_ASSERT(sub_mini_table);
    sub_message = _upb_Message_New(sub_mini_table, arena);
    *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*) =
        sub_message;
    UPB_PRIVATE(_upb_Message_SetPresence)(msg, f);
  }
  return sub_message;
}